

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedExecution.h
# Opt level: O1

void nrg::TimedExecution::push<TimedCaller>(Queue *queue,TimedCaller *fn)

{
  QueueElement elem;
  QueueElement local_68;
  duration local_40;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  local_40.__r = std::chrono::_V2::steady_clock::now();
  std::function<void()>::function<TimedCaller,void>((function<void()> *)local_38._M_pod_data,fn);
  local_68.when.__d.__r = (duration)(duration)local_40.__r;
  local_68.what.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_68.what.super__Function_base._M_functor._8_8_ = 0;
  local_68.what.super__Function_base._M_manager = (_Manager_type)0x0;
  local_68.what._M_invoker = p_Stack_20;
  if (local_28 != (_Manager_type)0x0) {
    local_68.what.super__Function_base._M_functor._M_unused._M_object = local_38._M_unused._M_object
    ;
    local_68.what.super__Function_base._M_functor._8_8_ = local_38._8_8_;
    local_68.what.super__Function_base._M_manager = local_28;
    local_28 = (_Manager_type)0x0;
    p_Stack_20 = (_Invoker_type)0x0;
  }
  std::vector<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
  ::emplace_back<nrg::TimedExecution::QueueElement>(&queue->c,&local_68);
  std::
  push_heap<__gnu_cxx::__normal_iterator<nrg::TimedExecution::QueueElement*,std::vector<nrg::TimedExecution::QueueElement,std::allocator<nrg::TimedExecution::QueueElement>>>,std::greater<nrg::TimedExecution::QueueElement>>
            ((queue->c).
             super__Vector_base<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (queue->c).
             super__Vector_base<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_68.what.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.what.super__Function_base._M_manager)
              ((_Any_data *)&local_68.what,(_Any_data *)&local_68.what,__destroy_functor);
  }
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { now(), std::move(fn) };
        push(queue, std::move(elem));
    }